

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_1000_1999.cpp
# Opt level: O1

void __thiscall psy::C::ParserTester::case1972(ParserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_1e1;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1e0;
  string local_1c8;
  Expectation local_1a8;
  Expectation local_f0;
  SyntaxKind local_38 [20];
  
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,
             "\n                     __builtin_choose_expr ( 0 ,\n                             __builtin_choose_expr ( 1 ,\n                                    sizeof ( int ) ,\n                                    sizeof ( double ) ) ,\n                             __builtin_choose_expr ( 2 , x , y ) )\n                    "
             ,"");
  Expectation::Expectation(&local_1a8);
  local_38[8] = AbstractDeclarator;
  local_38[9] = SizeofExpression;
  local_38[10] = TypeNameAsTypeReference;
  local_38[0xb] = TypeName;
  local_38[0xc] = BasicTypeSpecifier;
  local_38[0xd] = AbstractDeclarator;
  local_38[0xe] = ExtGNU_ChooseExpression;
  local_38[0xf] = IntegerConstantExpression;
  local_38[0] = ExtGNU_ChooseExpression;
  local_38[1] = IntegerConstantExpression;
  local_38[2] = ExtGNU_ChooseExpression;
  local_38[3] = IntegerConstantExpression;
  local_38[4] = SizeofExpression;
  local_38[5] = TypeNameAsTypeReference;
  local_38[6] = TypeName;
  local_38[7] = BasicTypeSpecifier;
  local_38[0x10] = IdentifierName;
  local_38[0x11] = IdentifierName;
  __l._M_len = 0x12;
  __l._M_array = local_38;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1e0,__l,&local_1e1);
  pEVar1 = Expectation::AST(&local_1a8,&local_1e0);
  Expectation::Expectation(&local_f0,pEVar1);
  parseExpression(this,&local_1c8,&local_f0);
  if (local_f0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_f0.declarations_);
  if (local_f0.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.ambiguityText_._M_dataplus._M_p != &local_f0.ambiguityText_.field_2) {
    operator_delete(local_f0.ambiguityText_._M_dataplus._M_p,
                    local_f0.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0.descriptorsE_);
  if (local_1e0.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e0.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_1a8.declarations_);
  if (local_1a8.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.ambiguityText_._M_dataplus._M_p != &local_1a8.ambiguityText_.field_2) {
    operator_delete(local_1a8.ambiguityText_._M_dataplus._M_p,
                    local_1a8.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8.descriptorsE_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ParserTester::case1972()
{
    parseExpression(R"(
                     __builtin_choose_expr ( 0 ,
                             __builtin_choose_expr ( 1 ,
                                    sizeof ( int ) ,
                                    sizeof ( double ) ) ,
                             __builtin_choose_expr ( 2 , x , y ) )
                    )",
                    Expectation().AST( { SyntaxKind::ExtGNU_ChooseExpression,
                                         SyntaxKind::IntegerConstantExpression,
                                         SyntaxKind::ExtGNU_ChooseExpression,
                                         SyntaxKind::IntegerConstantExpression,
                                         SyntaxKind::SizeofExpression,
                                         SyntaxKind::TypeNameAsTypeReference,
                                         SyntaxKind::TypeName,
                                         SyntaxKind::BasicTypeSpecifier,
                                         SyntaxKind::AbstractDeclarator,
                                         SyntaxKind::SizeofExpression,
                                         SyntaxKind::TypeNameAsTypeReference,
                                         SyntaxKind::TypeName,
                                         SyntaxKind::BasicTypeSpecifier,
                                         SyntaxKind::AbstractDeclarator,
                                         SyntaxKind::ExtGNU_ChooseExpression,
                                         SyntaxKind::IntegerConstantExpression,
                                         SyntaxKind::IdentifierName,
                                         SyntaxKind::IdentifierName }));
}